

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::ParseGoogleTestFlagsOnlyImpl<wchar_t>(int *argc,wchar_t **argv)

{
  bool bVar1;
  char *in_RSI;
  int *in_RDI;
  string *in_stack_00000010;
  int j;
  bool remove_flag;
  char *arg;
  string arg_string;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  string *str;
  int local_58;
  undefined7 in_stack_ffffffffffffffb8;
  byte in_stack_ffffffffffffffbf;
  string local_38 [36];
  int local_14;
  
  for (local_14 = 1; local_14 < *in_RDI; local_14 = local_14 + 1) {
    str = local_38;
    StreamableToString<wchar_t*>
              ((wchar_t **)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    std::__cxx11::string::c_str();
    in_stack_ffffffffffffffbf = 0;
    bVar1 = ParseGoogleTestFlag((char *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90
                                                ));
    if (bVar1) {
      in_stack_ffffffffffffffbf = 1;
    }
    else {
      in_stack_ffffffffffffff97 =
           ParseStringFlag<std::__cxx11::string>
                     ((char *)str,
                      (char *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
      if ((bool)in_stack_ffffffffffffff97) {
        LoadFlagsFromFile(in_stack_00000010);
        in_stack_ffffffffffffffbf = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                                (char *)in_stack_ffffffffffffff88);
        if ((((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_ffffffffffffff97,
                                                  in_stack_ffffffffffffff90),
                                      (char *)in_stack_ffffffffffffff88), bVar1)) ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90
                                                ),(char *)in_stack_ffffffffffffff88), bVar1)) ||
           ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90
                                                ),(char *)in_stack_ffffffffffffff88), bVar1 ||
            (bVar1 = HasGoogleTestFlagPrefix
                               ((char *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90
                                                )), bVar1)))) {
          g_help_flag = 1;
        }
      }
    }
    if ((in_stack_ffffffffffffffbf & 1) != 0) {
      for (local_58 = local_14; local_58 != *in_RDI; local_58 = local_58 + 1) {
        *(undefined8 *)(in_RSI + (long)local_58 * 8) =
             *(undefined8 *)(in_RSI + (long)(local_58 + 1) * 8);
      }
      *in_RDI = *in_RDI + -1;
      local_14 = local_14 + -1;
    }
    std::__cxx11::string::~string(local_38);
  }
  if ((g_help_flag & 1) != 0) {
    PrintColorEncoded(in_RSI);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    bool remove_flag = false;
    if (ParseGoogleTestFlag(arg)) {
      remove_flag = true;
#if GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (ParseStringFlag(arg, kFlagfileFlag, &GTEST_FLAG(flagfile))) {
      LoadFlagsFromFile(GTEST_FLAG(flagfile));
      remove_flag = true;
#endif  // GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }

    if (remove_flag) {
      // Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}